

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intMan.c
# Opt level: O3

void Inter_ManStop(Inter_Man_t *p,int fProved)

{
  int level;
  Vec_Ptr_t *__ptr;
  Vec_Int_t *__ptr_00;
  double dVar1;
  double dVar2;
  
  if (p->fVerbose != 0) {
    p->timeOther = p->timeTotal - (p->timeInt + p->timeCnf + p->timeSat + p->timeRwr + p->timeEqu);
    level = 0x907651;
    puts("Runtime statistics:");
    Abc_Print(level,"%s =","Rewriting  ");
    dVar1 = 0.0;
    if (p->timeTotal != 0) {
      dVar1 = ((double)p->timeRwr * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeRwr / 1000000.0,dVar1);
    Abc_Print(level,"%s =","CNF mapping");
    dVar1 = 0.0;
    if (p->timeTotal != 0) {
      dVar1 = ((double)p->timeCnf * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeCnf / 1000000.0,dVar1);
    Abc_Print(level,"%s =","SAT solving");
    dVar1 = 0.0;
    if (p->timeTotal != 0) {
      dVar1 = ((double)p->timeSat * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSat / 1000000.0,dVar1);
    Abc_Print(level,"%s =","Interpol   ");
    dVar1 = 0.0;
    if (p->timeTotal != 0) {
      dVar1 = ((double)p->timeInt * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeInt / 1000000.0,dVar1);
    Abc_Print(level,"%s =","Containment");
    dVar1 = 0.0;
    if (p->timeTotal != 0) {
      dVar1 = ((double)p->timeEqu * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeEqu / 1000000.0,dVar1);
    Abc_Print(level,"%s =","Other      ");
    dVar1 = 0.0;
    if (p->timeTotal != 0) {
      dVar1 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar1);
    Abc_Print(level,"%s =","TOTAL      ");
    dVar1 = (double)p->timeTotal;
    dVar2 = 0.0;
    if (p->timeTotal != 0) {
      dVar2 = (dVar1 * 100.0) / dVar1;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar1 / 1000000.0,dVar2);
  }
  if (p->vInters != (Vec_Ptr_t *)0x0) {
    Inter_ManInterDump(p,fProved);
  }
  if (p->pCnfAig != (Cnf_Dat_t *)0x0) {
    Cnf_DataFree(p->pCnfAig);
  }
  if (p->pAigTrans != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pAigTrans);
  }
  if (p->pInterNew != (Aig_Man_t *)0x0) {
    Aig_ManStop(p->pInterNew);
  }
  Inter_ManClean(p);
  __ptr = p->vInters;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      p->vInters->pArray = (void **)0x0;
      __ptr = p->vInters;
      if (__ptr == (Vec_Ptr_t *)0x0) goto LAB_005a443a;
    }
    free(__ptr);
    p->vInters = (Vec_Ptr_t *)0x0;
  }
LAB_005a443a:
  __ptr_00 = p->vVarsAB;
  if (__ptr_00 != (Vec_Int_t *)0x0) {
    if (__ptr_00->pArray != (int *)0x0) {
      free(__ptr_00->pArray);
      p->vVarsAB->pArray = (int *)0x0;
      __ptr_00 = p->vVarsAB;
      if (__ptr_00 == (Vec_Int_t *)0x0) goto LAB_005a446e;
    }
    free(__ptr_00);
  }
LAB_005a446e:
  free(p);
  return;
}

Assistant:

void Inter_ManStop( Inter_Man_t * p, int fProved )
{
    if ( p->fVerbose )
    {
        p->timeOther = p->timeTotal-p->timeRwr-p->timeCnf-p->timeSat-p->timeInt-p->timeEqu;
        printf( "Runtime statistics:\n" );
        ABC_PRTP( "Rewriting  ", p->timeRwr,   p->timeTotal );
        ABC_PRTP( "CNF mapping", p->timeCnf,   p->timeTotal );
        ABC_PRTP( "SAT solving", p->timeSat,   p->timeTotal );
        ABC_PRTP( "Interpol   ", p->timeInt,   p->timeTotal );
        ABC_PRTP( "Containment", p->timeEqu,   p->timeTotal );
        ABC_PRTP( "Other      ", p->timeOther, p->timeTotal );
        ABC_PRTP( "TOTAL      ", p->timeTotal, p->timeTotal );
    }

    if ( p->vInters )
        Inter_ManInterDump( p, fProved );

    if ( p->pCnfAig )
        Cnf_DataFree( p->pCnfAig );
    if ( p->pAigTrans )
        Aig_ManStop( p->pAigTrans );
    if ( p->pInterNew )
        Aig_ManStop( p->pInterNew );
    Inter_ManClean( p );
    Vec_PtrFreeP( &p->vInters );
    Vec_IntFreeP( &p->vVarsAB );
    ABC_FREE( p );
}